

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# po_man.cpp
# Opt level: O0

void __thiscall DRotatePoly::Tick(DRotatePoly *this)

{
  double *pdVar1;
  double dVar2;
  bool bVar3;
  FPolyObj *this_00;
  double local_30;
  TAngle<double> local_20;
  FPolyObj *local_18;
  FPolyObj *poly;
  DRotatePoly *this_local;
  
  poly = (FPolyObj *)this;
  this_00 = PO_GetPolyobj((this->super_DPolyAction).m_PolyObj);
  if (this_00 != (FPolyObj *)0x0) {
    dVar2 = (this->super_DPolyAction).m_Dist;
    if (((dVar2 != -1.0) || (NAN(dVar2))) &&
       ((this->super_DPolyAction).m_Dist < ABS((this->super_DPolyAction).m_Speed))) {
      pdVar1 = &(this->super_DPolyAction).m_Speed;
      if (0.0 < *pdVar1 || *pdVar1 == 0.0) {
        local_30 = (this->super_DPolyAction).m_Dist;
      }
      else {
        local_30 = -(this->super_DPolyAction).m_Dist;
      }
      (this->super_DPolyAction).m_Speed = local_30;
    }
    local_18 = this_00;
    TAngle<double>::TAngle(&local_20,(this->super_DPolyAction).m_Speed);
    bVar3 = FPolyObj::RotatePolyobj(this_00,&local_20,false);
    if ((bVar3) && ((dVar2 = (this->super_DPolyAction).m_Dist, dVar2 != -1.0 || (NAN(dVar2))))) {
      (this->super_DPolyAction).m_Dist =
           (this->super_DPolyAction).m_Dist - ABS((this->super_DPolyAction).m_Speed);
      dVar2 = (this->super_DPolyAction).m_Dist;
      if ((dVar2 == 0.0) && (!NAN(dVar2))) {
        SN_StopSequence(local_18);
        (*(this->super_DPolyAction).super_DThinker.super_DObject._vptr_DObject[4])();
      }
    }
  }
  return;
}

Assistant:

void DRotatePoly::Tick ()
{
	FPolyObj *poly = PO_GetPolyobj (m_PolyObj);
	if (poly == NULL) return;

	// Don't let non-perpetual polyobjs overshoot their targets.
	if (m_Dist != -1 && m_Dist < fabs(m_Speed))
	{
		m_Speed = m_Speed < 0 ? -m_Dist : m_Dist;
	}

	if (poly->RotatePolyobj (m_Speed))
	{
		if (m_Dist == -1)
		{ // perpetual polyobj
			return;
		}
		m_Dist -= fabs(m_Speed);
		if (m_Dist == 0)
		{
			SN_StopSequence (poly);
			Destroy ();
		}
	}
}